

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O1

void QSwipeGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  
  if (_c == WriteProperty) {
    if (_id == 3) {
      *(undefined8 *)(*(long *)(_o + 8) + 0xd8) = **_a;
      return;
    }
    if (_id != 2) {
      return;
    }
    *(undefined8 *)(*(long *)(_o + 8) + 0xb0) = **_a;
    return;
  }
  if (_c != ReadProperty) {
    return;
  }
  if ((uint)_id < 4) {
    piVar2 = (int *)*_a;
    switch(_id) {
    case 0:
      dVar1 = *(double *)(*(long *)(_o + 8) + 0xb0);
      iVar3 = (270.0 < dVar1 || dVar1 < 90.0) + 1;
      iVar4 = 0;
      if (dVar1 != 90.0) {
        iVar4 = iVar3;
      }
      if (NAN(dVar1)) {
        iVar4 = iVar3;
      }
      if (dVar1 < 0.0) {
        iVar4 = 0;
      }
      iVar3 = 0;
      if (dVar1 != 270.0) {
        iVar3 = iVar4;
      }
      if (NAN(dVar1)) {
        iVar3 = iVar4;
      }
      *piVar2 = iVar3;
      return;
    case 1:
      dVar1 = *(double *)(*(long *)(_o + 8) + 0xb0);
      iVar3 = (180.0 <= dVar1) + 3;
      iVar4 = 0;
      if (dVar1 != 180.0) {
        iVar4 = iVar3;
      }
      if (NAN(dVar1)) {
        iVar4 = iVar3;
      }
      if (dVar1 <= 0.0) {
        iVar4 = 0;
      }
      *piVar2 = iVar4;
      return;
    case 2:
      uVar5 = *(undefined8 *)(*(long *)(_o + 8) + 0xb0);
      break;
    case 3:
      uVar5 = *(undefined8 *)(*(long *)(_o + 8) + 0xd8);
    }
    *(undefined8 *)piVar2 = uVar5;
    return;
  }
  return;
}

Assistant:

void QSwipeGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSwipeGesture *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<SwipeDirection*>(_v) = _t->horizontalDirection(); break;
        case 1: *reinterpret_cast<SwipeDirection*>(_v) = _t->verticalDirection(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->swipeAngle(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->QSwipeGesture::d_func()->velocity(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 2: _t->setSwipeAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->QSwipeGesture::d_func()->setVelocity(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
}